

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

bool __thiscall pbrt::SquareMatrix<4>::IsIdentity(SquareMatrix<4> *this)

{
  float fVar1;
  int i;
  ulong uVar2;
  Float (*paFVar3) [4];
  int j;
  ulong uVar4;
  bool bVar5;
  
  paFVar3 = (Float (*) [4])this;
  for (uVar2 = 0; uVar2 != 4; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; uVar4 != 4; uVar4 = uVar4 + 1) {
      if (uVar2 == uVar4) {
        fVar1 = *(float *)((long)this->m + uVar2 * 0x14);
        bVar5 = fVar1 == 1.0;
      }
      else {
        fVar1 = (*(Float (*) [4])*paFVar3)[uVar4];
        bVar5 = fVar1 == 0.0;
      }
      if ((!bVar5) || (NAN(fVar1))) goto LAB_0048278f;
    }
    paFVar3 = paFVar3 + 1;
  }
LAB_0048278f:
  return 3 < uVar2;
}

Assistant:

PBRT_CPU_GPU
    bool IsIdentity() const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (i == j) {
                    if (m[i][j] != 1)
                        return false;
                } else if (m[i][j] != 0)
                    return false;
            }
        return true;
    }